

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O3

void __thiscall senjo::UCIAdapter::OptsCommand(UCIAdapter *this,char *param_1)

{
  _List_node_base *p_Var1;
  int iVar2;
  long lVar3;
  _Rb_tree_node_base *p_Var4;
  _List_node_base *p_Var5;
  Output out;
  list<senjo::EngineOption,_std::allocator<senjo::EngineOption>_> opts;
  char local_b0;
  undefined7 uStack_af;
  long local_a8;
  long local_a0 [2];
  char local_90;
  undefined7 uStack_8f;
  long local_88;
  long local_80 [2];
  Output local_70;
  long local_68;
  long local_60 [2];
  Output local_50;
  _List_base<senjo::EngineOption,_std::allocator<senjo::EngineOption>_> local_48;
  
  (*this->engine->_vptr_ChessEngine[5])((_List_node_base *)&local_48);
  if (local_48._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_48) {
    p_Var5 = local_48._M_impl._M_node.super__List_node_base._M_next;
    do {
      p_Var1 = p_Var5 + 1;
      iVar2 = *(int *)&p_Var5[1]._M_prev;
      if (iVar2 - 4U < 2) {
LAB_00135310:
        Output::Output(&local_50,InfoPrefix);
        (*(code *)p_Var1->_M_next->_M_next)(&local_90,p_Var1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)CONCAT71(uStack_8f,local_90),local_88);
        local_b0 = ':';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_b0,1);
        (*(code *)p_Var1->_M_next->_M_prev)(&local_b0,p_Var1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)CONCAT71(uStack_af,local_b0),local_a8);
        local_70._vptr_Output._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)&local_70,1);
        (*(code *)p_Var1->_M_next[1]._M_next)(&local_70,p_Var1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   (char *)CONCAT71(local_70._vptr_Output._1_7_,local_70._vptr_Output._0_1_),
                   local_68);
        if ((long *)CONCAT71(local_70._vptr_Output._1_7_,local_70._vptr_Output._0_1_) != local_60) {
          operator_delete((long *)CONCAT71(local_70._vptr_Output._1_7_,local_70._vptr_Output._0_1_),
                          local_60[0] + 1);
        }
        if ((long *)CONCAT71(uStack_af,local_b0) != local_a0) {
          operator_delete((long *)CONCAT71(uStack_af,local_b0),local_a0[0] + 1);
        }
        if ((long *)CONCAT71(uStack_8f,local_90) != local_80) {
          operator_delete((long *)CONCAT71(uStack_8f,local_90),local_80[0] + 1);
        }
        Output::~Output(&local_50);
      }
      else if (iVar2 == 3) {
        lVar3 = (*(code *)p_Var1->_M_next[4]._M_next)(p_Var1);
        Output::Output(&local_70,InfoPrefix);
        (*(code *)p_Var1->_M_next->_M_next)(&local_90,p_Var1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)CONCAT71(uStack_8f,local_90),local_88);
        local_b0 = ':';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_b0,1);
        (*(code *)p_Var1->_M_next->_M_prev)(&local_b0,p_Var1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)CONCAT71(uStack_af,local_b0),local_a8);
        if ((long *)CONCAT71(uStack_af,local_b0) != local_a0) {
          operator_delete((long *)CONCAT71(uStack_af,local_b0),local_a0[0] + 1);
        }
        if ((long *)CONCAT71(uStack_8f,local_90) != local_80) {
          operator_delete((long *)CONCAT71(uStack_8f,local_90),local_80[0] + 1);
        }
        for (p_Var4 = *(_Rb_tree_node_base **)(lVar3 + 0x18);
            p_Var4 != (_Rb_tree_node_base *)(lVar3 + 8);
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
          local_90 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_90,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
        }
        Output::~Output(&local_70);
      }
      else if (iVar2 == 2) goto LAB_00135310;
      p_Var5 = (((_List_impl *)&p_Var5->_M_next)->_M_node).super__List_node_base._M_next;
    } while (p_Var5 != (_List_node_base *)&local_48);
  }
  std::__cxx11::_List_base<senjo::EngineOption,_std::allocator<senjo::EngineOption>_>::_M_clear
            (&local_48);
  return;
}

Assistant:

void UCIAdapter::OptsCommand(const char* /*params*/)
{
  std::list<EngineOption> opts = engine->GetOptions();
  std::list<EngineOption>::const_iterator it;
  for (it = opts.begin(); it != opts.end(); ++it) {
    const EngineOption& opt = *it;
    switch (opt.GetType()) {
    case EngineOption::Checkbox:
    case EngineOption::Spin:
    case EngineOption::String:
      Output() << opt.GetTypeName() << ':' << opt.GetName() << ' '
               << opt.GetValue();
      break;
    case EngineOption::ComboBox: {
      const std::set<std::string>& values = opt.GetComboValues();
      std::set<std::string>::const_iterator it;
      Output out;
      out << opt.GetTypeName() << ':' << opt.GetName();
      for (it = values.begin(); it != values.end(); ++it) {
        out << ' ' << *it;
      }
    }
    default:
      break;
    }
  }
}